

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  void *pvVar8;
  void *pvVar9;
  byte bVar10;
  mz_bool mVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  mz_zip_internal_state *pmVar15;
  ulong uVar16;
  short *__ptr;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  mz_zip_error mVar21;
  mz_uint32 mVar22;
  int *piVar23;
  mz_uint32 t;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  mz_uint64 mVar28;
  mz_zip_internal_state *pmVar29;
  uint uVar30;
  size_t sVar31;
  short *psVar32;
  ulong uVar33;
  bool bVar34;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  
  uVar19 = pZip->m_archive_size;
  mVar21 = MZ_ZIP_NOT_AN_ARCHIVE;
  if (0x15 < uVar19) {
    mVar28 = 0;
    if (0x1000 < (long)uVar19) {
      mVar28 = uVar19 - 0x1000;
    }
    do {
      sVar31 = uVar19 - mVar28;
      if (0xfff < sVar31) {
        sVar31 = 0x1000;
      }
      sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar28,buf_u32,sVar31);
      if (sVar13 != sVar31) break;
      for (uVar30 = (int)sVar31 - 4; -1 < (int)uVar30; uVar30 = uVar30 - 1) {
        if ((*(int *)((long)buf_u32 + (ulong)uVar30) == 0x6054b50) &&
           (uVar19 = uVar30 + mVar28, 0x15 < pZip->m_archive_size - uVar19)) {
          sVar31 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19,buf_u32,0x16);
          if (sVar31 != 0x16) goto LAB_00107598;
          if (buf_u32[0] != 0x6054b50) {
            mVar21 = MZ_ZIP_NOT_AN_ARCHIVE;
            goto LAB_0010759b;
          }
          mVar21 = MZ_ZIP_NOT_AN_ARCHIVE;
          if (((0x4b < (long)uVar19) &&
              (sVar31 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19 - 0x14,
                                         zip64_end_of_central_dir_locator_u32,0x14), sVar31 == 0x14)
              ) && (zip64_end_of_central_dir_locator_u32[0] == 0x7064b50)) {
            pZip->m_pState->m_zip64 = 1;
          }
          if ((pZip->m_pState->m_zip64 != 0) &&
             (((long)uVar19 < 0x4c ||
              ((mVar11 = mz_zip_reader_eocd64_valid
                                   (pZip,uVar19 - 0x4c,
                                    (uint8_t *)zip64_end_of_central_dir_header_u32), mVar11 == 0 &&
               ((pZip->m_archive_size - 0x38 < (ulong)zip64_end_of_central_dir_locator_u32._8_8_ ||
                (mVar11 = mz_zip_reader_eocd64_valid
                                    (pZip,zip64_end_of_central_dir_locator_u32._8_8_,
                                     (uint8_t *)zip64_end_of_central_dir_header_u32), mVar11 == 0)))
               ))))) goto LAB_0010759b;
          pZip->m_total_files = (uint)buf_u32[2]._2_2_;
          pmVar29 = pZip->m_pState;
          iVar5 = pmVar29->m_zip64;
          if (iVar5 == 0) {
            zip64_end_of_central_dir_header_u32[6] = (mz_uint32)(ushort)buf_u32[2];
            zip64_end_of_central_dir_header_u32[5] = (mz_uint32)buf_u32[1]._2_2_;
            uVar14 = (ulong)buf_u32[4];
            mVar22 = buf_u32[3];
            zip64_end_of_central_dir_header_u32[8] = (uint)buf_u32[2]._2_2_;
            uVar30 = (uint)(ushort)buf_u32[1];
LAB_00106db7:
            if ((zip64_end_of_central_dir_header_u32[8] == zip64_end_of_central_dir_header_u32[6])
               && ((uVar30 == 0 && zip64_end_of_central_dir_header_u32[5] == 0 ||
                   (zip64_end_of_central_dir_header_u32[5] == 1 && uVar30 == 1)))) {
              uVar16 = (ulong)mVar22;
              uVar17 = (ulong)zip64_end_of_central_dir_header_u32[8];
              if (uVar17 * 0x2e < uVar16 || uVar17 * 0x2e - uVar16 == 0) {
                uVar24 = uVar14 + uVar16;
                uVar33 = pZip->m_archive_size;
                if ((uVar24 <= uVar33) && (uVar20 = uVar19 - uVar24, uVar24 <= uVar19)) {
                  if (iVar5 != 0) {
                    if (uVar20 < 0x4c) goto LAB_00106d7f;
                    uVar20 = uVar20 - 0x4c;
                  }
                  if (((pZip->m_zip_type & ~MZ_ZIP_TYPE_USER) == MZ_ZIP_TYPE_FILE) &&
                     (pmVar29->m_file_archive_start_ofs == 0)) {
                    pmVar29->m_file_archive_start_ofs = uVar20;
                    pZip->m_archive_size = uVar33 - uVar20;
                  }
                  pZip->m_central_directory_file_ofs = uVar14;
                  if (zip64_end_of_central_dir_header_u32[8] == 0) {
                    return 1;
                  }
                  pmVar15 = pmVar29;
                  if ((pmVar29->m_central_dir).m_capacity < uVar16) {
                    mVar11 = mz_zip_array_ensure_capacity(pZip,&pmVar29->m_central_dir,uVar16,0);
                    if (mVar11 == 0) goto LAB_001071b5;
                    pmVar15 = pZip->m_pState;
                    uVar17 = (ulong)pZip->m_total_files;
                  }
                  (pmVar29->m_central_dir).m_size = uVar16;
                  pmVar29 = pmVar15;
                  if ((pmVar15->m_central_dir_offsets).m_capacity < uVar17) {
                    mVar11 = mz_zip_array_ensure_capacity
                                       (pZip,&pmVar15->m_central_dir_offsets,uVar17,0);
                    if (mVar11 == 0) goto LAB_001071b5;
                    pmVar29 = pZip->m_pState;
                  }
                  (pmVar15->m_central_dir_offsets).m_size = uVar17;
                  if ((flags >> 0xb & 1) == 0) {
                    uVar19 = (ulong)pZip->m_total_files;
                    pmVar15 = pmVar29;
                    if ((pmVar29->m_sorted_central_dir_offsets).m_capacity < uVar19) {
                      mVar11 = mz_zip_array_ensure_capacity
                                         (pZip,&pmVar29->m_sorted_central_dir_offsets,uVar19,0);
                      if (mVar11 == 0) goto LAB_001071b5;
                      pmVar15 = pZip->m_pState;
                    }
                    (pmVar29->m_sorted_central_dir_offsets).m_size = uVar19;
                    pmVar29 = pmVar15;
                  }
                  sVar31 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar14,(pmVar29->m_central_dir).m_p,
                                            uVar16);
                  if (sVar31 != uVar16) goto LAB_00107598;
                  piVar23 = (int *)(pZip->m_pState->m_central_dir).m_p;
                  uVar19 = 0;
                  goto LAB_00106fcb;
                }
              }
LAB_00106d7f:
              mVar21 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              goto LAB_0010759b;
            }
          }
          else {
            if ((ulong)zip64_end_of_central_dir_header_u32._4_8_ < 0x2c) goto LAB_00106d7f;
            if (zip64_end_of_central_dir_locator_u32[4] == 1) {
              mVar21 = MZ_ZIP_TOO_MANY_FILES;
              if ((zip64_end_of_central_dir_header_u32[9] == 0) &&
                 (pZip->m_total_files = zip64_end_of_central_dir_header_u32[8],
                 zip64_end_of_central_dir_header_u32[7] == 0)) {
                uVar14 = zip64_end_of_central_dir_header_u32._48_8_;
                mVar22 = zip64_end_of_central_dir_header_u32[10];
                uVar30 = zip64_end_of_central_dir_header_u32[4];
                if (zip64_end_of_central_dir_header_u32[0xb] == 0) goto LAB_00106db7;
                mVar21 = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
              }
              goto LAB_0010759b;
            }
          }
          mVar21 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          goto LAB_0010759b;
        }
      }
      if (mVar28 == 0) break;
      uVar19 = pZip->m_archive_size;
      uVar14 = uVar19 - mVar28;
      mVar28 = mVar28 - 0xffd;
    } while (uVar14 < 0x10015);
    mVar21 = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
LAB_0010759b:
  pZip->m_last_error = mVar21;
  return 0;
LAB_00106fcb:
  uVar12 = pZip->m_total_files;
  uVar16 = (ulong)uVar12;
  if (uVar16 <= uVar19) goto LAB_001071cf;
  if ((mVar22 < 0x2e) || (*piVar23 != 0x2014b50)) {
LAB_001071c1:
    mVar21 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    goto LAB_0010759b;
  }
  pmVar29 = pZip->m_pState;
  *(int *)((long)(pmVar29->m_central_dir_offsets).m_p + uVar19 * 4) =
       (int)piVar23 - *(int *)&(pmVar29->m_central_dir).m_p;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar29->m_sorted_central_dir_offsets).m_p + uVar19 * 4) = (int)uVar19;
  }
  uVar12 = piVar23[5];
  uVar16 = (ulong)uVar12;
  uVar6 = piVar23[6];
  uVar17 = (ulong)uVar6;
  if (pmVar29->m_zip64_has_extended_info_fields == 0) {
    uVar3 = *(ushort *)((long)piVar23 + 0x1e);
    uVar24 = (ulong)uVar3;
    if (uVar3 != 0) {
      uVar33 = uVar17;
      if (uVar17 < uVar16) {
        uVar33 = uVar16;
      }
      uVar27 = (uint)uVar33;
      if (uVar33 <= *(uint *)((long)piVar23 + 0x2a)) {
        uVar27 = *(uint *)((long)piVar23 + 0x2a);
      }
      if (uVar27 == 0xffffffff) {
        uVar4 = *(ushort *)(piVar23 + 7);
        if (mVar22 < (uint)uVar4 + (uint)uVar3 + 0x2e) {
          __ptr = (short *)malloc(uVar24);
          if (__ptr == (short *)0x0) goto LAB_001071b5;
          sVar31 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(ulong)uVar4 + uVar14 + 0x2e,__ptr,uVar24);
          psVar32 = __ptr;
          if (sVar31 != uVar24) {
            free(__ptr);
LAB_00107598:
            mVar21 = MZ_ZIP_FILE_READ_FAILED;
            goto LAB_0010759b;
          }
        }
        else {
          __ptr = (short *)0x0;
          psVar32 = (short *)((long)piVar23 + (ulong)uVar4 + 0x2e);
        }
        do {
          if ((uint)uVar24 < 4) {
LAB_001071bc:
            free(__ptr);
            goto LAB_001071c1;
          }
          uVar33 = (ulong)(ushort)psVar32[1] + 4;
          if (uVar24 < uVar33) goto LAB_001071bc;
          if (*psVar32 == 1) {
            pmVar29 = pZip->m_pState;
            pmVar29->m_zip64 = 1;
            pmVar29->m_zip64_has_extended_info_fields = 1;
            break;
          }
          uVar27 = ((uint)uVar24 - (uint)(ushort)psVar32[1]) - 4;
          uVar24 = (ulong)uVar27;
          psVar32 = (short *)((long)psVar32 + uVar33);
        } while (uVar27 != 0);
        free(__ptr);
      }
    }
  }
  if (((uVar12 != 0xffffffff) && (uVar6 != 0xffffffff)) &&
     (((*(int *)((long)piVar23 + 10) == 0 && (uVar6 != uVar12)) || ((uVar17 != 0 && (uVar16 == 0))))
     )) goto LAB_001071c1;
  uVar3 = *(ushort *)((long)piVar23 + 0x22);
  if ((uVar3 == 0xffff) || (uVar3 != uVar30 && uVar3 != 1)) {
    mVar21 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    goto LAB_0010759b;
  }
  if ((uVar12 != 0xffffffff) &&
     (pZip->m_archive_size < *(uint *)((long)piVar23 + 0x2a) + uVar16 + 0x1e)) goto LAB_001071c1;
  if ((*(byte *)((long)piVar23 + 9) & 0x20) != 0) {
    mVar21 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    goto LAB_0010759b;
  }
  uVar12 = (uint)*(ushort *)(piVar23 + 8) +
           (uint)*(ushort *)((long)piVar23 + 0x1e) + (uint)*(ushort *)(piVar23 + 7) + 0x2e;
  bVar34 = mVar22 < uVar12;
  mVar22 = mVar22 - uVar12;
  if (bVar34) goto LAB_001071c1;
  piVar23 = (int *)((long)piVar23 + (ulong)uVar12);
  uVar19 = uVar19 + 1;
  goto LAB_00106fcb;
LAB_001071b5:
  mVar21 = MZ_ZIP_ALLOC_FAILED;
  goto LAB_0010759b;
LAB_001071cf:
  if (((flags >> 0xb & 1) == 0) && (1 < uVar12)) {
    pmVar29 = pZip->m_pState;
    puVar7 = (uint *)(pmVar29->m_sorted_central_dir_offsets).m_p;
    uVar19 = (ulong)(uVar12 - 2 >> 1);
    uVar14 = uVar19;
LAB_0010720d:
    do {
      uVar17 = uVar19 * 2 + 1;
      if (uVar17 < uVar16) {
        pvVar8 = (pmVar29->m_central_dir).m_p;
        pvVar9 = (pmVar29->m_central_dir_offsets).m_p;
        if (uVar19 * 2 + 2 < uVar16) {
          uVar33 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[uVar17] * 4);
          uVar24 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[uVar19 * 2 + 2] * 4);
          uVar3 = *(ushort *)((long)pvVar8 + uVar33 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar8 + uVar24 + 0x1c);
          uVar30 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar30 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar20 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar20 + uVar33 + 0x2e), bVar10 = bVar18
              , pbVar1 < (byte *)((long)pvVar8 + uVar30 + uVar33 + 0x2e); uVar20 = uVar20 + 1) {
            bVar10 = *pbVar1;
            bVar18 = bVar10 + 0x20;
            if (0x19 < (byte)(bVar10 + 0xbf)) {
              bVar18 = bVar10;
            }
            bVar2 = *(byte *)((long)pvVar8 + uVar20 + uVar24 + 0x2e);
            bVar10 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar10 = bVar2;
            }
            if (bVar18 != bVar10) break;
          }
          bVar34 = bVar18 < bVar10;
          if (uVar30 == uVar20) {
            bVar34 = uVar3 < uVar4;
          }
          uVar24 = (ulong)bVar34;
        }
        else {
          uVar24 = 0;
        }
        uVar24 = uVar24 + uVar17;
        uVar30 = puVar7[uVar19];
        uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)uVar30 * 4);
        uVar33 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[uVar24] * 4);
        uVar3 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar8 + uVar33 + 0x1c);
        uVar12 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar12 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar20 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar20 + uVar17 + 0x2e), bVar10 = bVar18,
            pbVar1 < (byte *)((long)pvVar8 + uVar12 + uVar17 + 0x2e); uVar20 = uVar20 + 1) {
          bVar18 = *pbVar1;
          bVar10 = bVar18 + 0x20;
          if (0x19 < (byte)(bVar18 + 0xbf)) {
            bVar10 = bVar18;
          }
          bVar2 = *(byte *)((long)pvVar8 + uVar20 + uVar33 + 0x2e);
          bVar18 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar18 = bVar2;
          }
          if (bVar10 != bVar18) break;
          bVar18 = bVar10;
        }
        bVar34 = bVar18 <= bVar10;
        if (uVar12 == uVar20) {
          bVar34 = uVar4 <= uVar3;
        }
        if (!bVar34) {
          puVar7[uVar19] = puVar7[uVar24];
          puVar7[uVar24] = uVar30;
          uVar19 = uVar24;
          goto LAB_0010720d;
        }
      }
      bVar34 = uVar14 != 0;
      uVar19 = uVar14 - 1;
      uVar14 = uVar19;
    } while (bVar34);
LAB_0010757d:
    uVar19 = uVar16 - 1;
    if (uVar19 != 0) {
      uVar30 = puVar7[uVar16 - 1];
      puVar7[uVar16 - 1] = *puVar7;
      *puVar7 = uVar30;
      lVar25 = 0;
      while( true ) {
        uVar14 = lVar25 * 2 + 1;
        uVar16 = uVar19;
        if (uVar19 <= uVar14) break;
        pvVar8 = (pmVar29->m_central_dir).m_p;
        pvVar9 = (pmVar29->m_central_dir_offsets).m_p;
        if (lVar25 * 2 + 2U < uVar19) {
          uVar24 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[uVar14] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[lVar25 * 2 + 2] * 4);
          uVar3 = *(ushort *)((long)pvVar8 + uVar24 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
          uVar12 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar12 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar33 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar33 + uVar24 + 0x2e), bVar10 = bVar18
              , pbVar1 < (byte *)((long)pvVar8 + uVar12 + uVar24 + 0x2e); uVar33 = uVar33 + 1) {
            bVar10 = *pbVar1;
            bVar18 = bVar10 + 0x20;
            if (0x19 < (byte)(bVar10 + 0xbf)) {
              bVar18 = bVar10;
            }
            bVar2 = *(byte *)((long)pvVar8 + uVar33 + uVar17 + 0x2e);
            bVar10 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar10 = bVar2;
            }
            if (bVar18 != bVar10) break;
          }
          bVar34 = bVar18 < bVar10;
          if (uVar12 == uVar33) {
            bVar34 = uVar3 < uVar4;
          }
          uVar17 = (ulong)bVar34;
        }
        else {
          uVar17 = 0;
        }
        lVar26 = uVar17 + uVar14;
        uVar14 = (ulong)*(uint *)((long)pvVar9 + (ulong)uVar30 * 4);
        uVar17 = (ulong)*(uint *)((long)pvVar9 + (ulong)puVar7[lVar26] * 4);
        uVar3 = *(ushort *)((long)pvVar8 + uVar14 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar8 + uVar17 + 0x1c);
        uVar12 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar12 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar24 = 0; pbVar1 = (byte *)((long)pvVar8 + uVar24 + uVar14 + 0x2e), bVar10 = bVar18,
            pbVar1 < (byte *)((long)pvVar8 + uVar12 + uVar14 + 0x2e); uVar24 = uVar24 + 1) {
          bVar10 = *pbVar1;
          bVar18 = bVar10 + 0x20;
          if (0x19 < (byte)(bVar10 + 0xbf)) {
            bVar18 = bVar10;
          }
          bVar2 = *(byte *)((long)pvVar8 + uVar24 + uVar17 + 0x2e);
          bVar10 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar10 = bVar2;
          }
          if (bVar18 != bVar10) break;
        }
        bVar34 = bVar10 <= bVar18;
        if (uVar12 == uVar24) {
          bVar34 = uVar4 <= uVar3;
        }
        if (bVar34) break;
        puVar7[lVar25] = puVar7[lVar26];
        puVar7[lVar26] = uVar30;
        lVar25 = lVar26;
      }
      goto LAB_0010757d;
    }
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint flags) {
  mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0,
          cdir_disk_index = 0;
  mz_uint64 cdir_ofs = 0, eocd_ofs = 0, archive_ofs = 0;
  mz_int64 cur_file_ofs = 0;
  const mz_uint8 *p;

  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  mz_uint32 zip64_end_of_central_dir_locator_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

  mz_uint32 zip64_end_of_central_dir_header_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_end_of_central_dir =
      (mz_uint8 *)zip64_end_of_central_dir_header_u32;

  mz_uint64 zip64_end_of_central_dir_ofs = 0;

  /* Basic sanity checks - reject files which are too small, and check the first
   * 4 bytes of the file to make sure a local header is there. */
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (!mz_zip_reader_locate_header_sig(
          pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG,
          MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
    return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

  eocd_ofs = cur_file_ofs;
  /* Read and verify the end of central directory record. */
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                       MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)) {
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE,
                      pZip64_locator,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) ==
        MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) {
      if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) ==
          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG) {
        pZip->m_pState->m_zip64 = MZ_TRUE;
      }
    }
  }

  if (pZip->m_pState->m_zip64) {
    /* Try locating the EOCD64 right before the EOCD64 locator. This works even
     * when the effective start of the zip header is not yet known. */
    if (cur_file_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    zip64_end_of_central_dir_ofs = cur_file_ofs -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

    if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                    pZip64_end_of_central_dir)) {
      /* That failed, try reading where the locator tells us to. */
      zip64_end_of_central_dir_ofs = MZ_READ_LE64(
          pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);

      if (zip64_end_of_central_dir_ofs >
          (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

      if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                      pZip64_end_of_central_dir))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }
  }

  pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
  cdir_entries_on_this_disk =
      MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

  if (pZip->m_pState->m_zip64) {
    mz_uint32 zip64_total_num_of_disks =
        MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
    mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
    mz_uint64 zip64_size_of_central_directory =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

    if (zip64_size_of_end_of_central_dir_record <
        (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (zip64_total_num_of_disks != 1U)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    /* Check for miniz's practical limits */
    if (zip64_cdir_total_entries > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

    if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    cdir_entries_on_this_disk =
        (mz_uint32)zip64_cdir_total_entries_on_this_disk;

    /* Check for miniz's current practical limits (sorry, this should be enough
     * for millions of files) */
    if (zip64_size_of_central_directory > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    cdir_size = (mz_uint32)zip64_size_of_central_directory;

    num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir +
                                 MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

    cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir +
                                   MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

    cdir_ofs =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
  }

  if (pZip->m_total_files != cdir_entries_on_this_disk)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (cdir_size <
      (mz_uint64)pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if (eocd_ofs < cdir_ofs + cdir_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* The end of central dir follows the central dir, unless the zip file has
   * some trailing data (e.g. it is appended to an executable file). */
  archive_ofs = eocd_ofs - (cdir_ofs + cdir_size);
  if (pZip->m_pState->m_zip64) {
    if (archive_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    archive_ofs -= MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
  }

  /* Update the archive start position, but only if not specified. */
  if ((pZip->m_zip_type == MZ_ZIP_TYPE_FILE ||
       pZip->m_zip_type == MZ_ZIP_TYPE_CFILE) &&
      pZip->m_pState->m_file_archive_start_ofs == 0) {
    pZip->m_pState->m_file_archive_start_ofs = archive_ofs;
    pZip->m_archive_size -= archive_ofs;
  }

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;
    /* Read the entire central directory into a heap block, and allocate another
     * heap block to hold the unsorted central dir file record offsets, and
     * possibly another to hold the sorted indices. */
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    /* Now create an index into the central directory file records, do some
     * basic sanity checking on each record */
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, disk_index, bit_flags, filename_size,
          ext_data_size;
      mz_uint64 comp_size, decomp_size, local_header_ofs;

      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;

      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
      ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

      if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
          (ext_data_size) &&
          (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) ==
           MZ_UINT32_MAX)) {
        /* Attempt to find zip64 extended information field in the entry's extra
         * data */
        mz_uint32 extra_size_remaining = ext_data_size;

        if (extra_size_remaining) {
          const mz_uint8 *pExtra_data;
          void *buf = NULL;

          if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size >
              n) {
            buf = MZ_MALLOC(ext_data_size);
            if (buf == NULL)
              return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

            if (pZip->m_pRead(pZip->m_pIO_opaque,
                              cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                  filename_size,
                              buf, ext_data_size) != ext_data_size) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            pExtra_data = (mz_uint8 *)buf;
          } else {
            pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
          }

          do {
            mz_uint32 field_id;
            mz_uint32 field_data_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

            if ((field_data_size + sizeof(mz_uint16) * 2) >
                extra_size_remaining) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
              /* Ok, the archive didn't have any zip64 headers but it uses a
               * zip64 extended information field so mark it as zip64 anyway
               * (this can occur with infozip's zip util when it reads
               * compresses files from stdin). */
              pZip->m_pState->m_zip64 = MZ_TRUE;
              pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
              break;
            }

            pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
            extra_size_remaining =
                extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
          } while (extra_size_remaining);

          MZ_FREE(buf);
        }
      }

      /* I've seen archives that aren't marked as zip64 that uses zip64 ext
       * data, argh */
      if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX)) {
        if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
             (decomp_size != comp_size)) ||
            (decomp_size && !comp_size))
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index == MZ_UINT16_MAX) ||
          ((disk_index != num_this_disk) && (disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

      if (comp_size != MZ_UINT32_MAX) {
        if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
             MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
      if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}